

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void load_buffer_8x16(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  __m128i *palVar1;
  __m128i alVar2;
  undefined1 auVar3 [16];
  __m128i alVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __m128i alVar8;
  undefined1 auVar9 [16];
  __m128i alVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i alVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i alVar17;
  __m128i alVar18;
  __m128i alVar19;
  undefined1 auVar20 [16];
  __m128i alVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  __m128i alVar25;
  __m128i alVar26;
  undefined1 auVar27 [16];
  __m128i alVar28;
  __m128i alVar29;
  undefined1 auVar30 [16];
  __m128i alVar31;
  __m128i alVar32;
  undefined1 auVar33 [16];
  __m128i alVar34;
  __m128i alVar35;
  undefined1 auVar36 [16];
  __m128i alVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i alVar41;
  __m128i alVar42;
  __m128i in_XMM9;
  undefined1 auVar43 [16];
  __m128i alVar44;
  undefined1 auVar45 [16];
  __m128i alVar46;
  undefined1 auVar47 [16];
  
  palVar1 = (__m128i *)(input + stride * 8);
  if (flipud == 0) {
    alVar26 = *(__m128i *)input;
    *out = alVar26;
    alVar19 = *(__m128i *)(input + stride);
    out[1] = alVar19;
    alVar8 = *(__m128i *)(input + stride * 2);
    out[2] = alVar8;
    alVar2 = *(__m128i *)(input + stride * 3);
    out[3] = alVar2;
    alVar37 = *(__m128i *)(input + stride * 4);
    out[4] = alVar37;
    alVar35 = *(__m128i *)(input + stride * 5);
    out[5] = alVar35;
    alVar13 = *(__m128i *)(input + stride * 6);
    out[6] = alVar13;
    auVar43 = *(undefined1 (*) [16])(input + stride * 7);
    if (fliplr != 0) {
      alVar37 = (__m128i)pshufb((undefined1  [16])alVar37,(undefined1  [16])_DAT_0056c1a0);
      alVar35 = (__m128i)pshufb((undefined1  [16])alVar35,(undefined1  [16])_DAT_0056c1a0);
      alVar13 = (__m128i)pshufb((undefined1  [16])alVar13,(undefined1  [16])_DAT_0056c1a0);
      auVar43 = pshufb(auVar43,(undefined1  [16])_DAT_0056c1a0);
      alVar2 = (__m128i)pshufb((undefined1  [16])alVar2,(undefined1  [16])_DAT_0056c1a0);
      alVar8 = (__m128i)pshufb((undefined1  [16])alVar8,(undefined1  [16])_DAT_0056c1a0);
      alVar19 = (__m128i)pshufb((undefined1  [16])alVar19,(undefined1  [16])_DAT_0056c1a0);
      alVar26 = (__m128i)pshufb((undefined1  [16])alVar26,(undefined1  [16])_DAT_0056c1a0);
      in_XMM9 = _DAT_0056c1a0;
    }
    auVar6 = pmovsxwd((undefined1  [16])in_XMM9,(undefined1  [16])alVar26);
    alVar46[0]._0_4_ = auVar6._0_4_ << shift;
    alVar46[0]._4_4_ = auVar6._4_4_;
    alVar46[1]._0_4_ = auVar6._8_4_;
    alVar46[1]._4_4_ = auVar6._12_4_;
    *out = alVar46;
    auVar39._8_4_ = (undefined4)alVar26[1];
    auVar39._12_4_ = alVar26[1]._4_4_;
    auVar39._0_8_ = alVar26[1];
    auVar6 = pmovsxwd(auVar39,auVar39);
    alVar31[0]._0_4_ = auVar6._0_4_ << shift;
    alVar31[0]._4_4_ = auVar6._4_4_;
    alVar31[1]._0_4_ = auVar6._8_4_;
    alVar31[1]._4_4_ = auVar6._12_4_;
    out[1] = alVar31;
    auVar6 = pmovsxwd((undefined1  [16])alVar31,(undefined1  [16])alVar19);
    alVar32[0]._0_4_ = auVar6._0_4_ << shift;
    alVar32[0]._4_4_ = auVar6._4_4_;
    alVar32[1]._0_4_ = auVar6._8_4_;
    alVar32[1]._4_4_ = auVar6._12_4_;
    out[2] = alVar32;
    auVar39 = pmovsxwd((undefined1  [16])alVar32,(undefined1  [16])alVar37);
    auVar45._8_4_ = (undefined4)alVar37[1];
    auVar45._12_4_ = alVar37[1]._4_4_;
    auVar45._0_8_ = alVar37[1];
    auVar45 = pmovsxwd(auVar45,auVar45);
    auVar15._8_4_ = (undefined4)alVar19[1];
    auVar15._12_4_ = alVar19[1]._4_4_;
    auVar15._0_8_ = alVar19[1];
    auVar6 = pmovsxwd(auVar15,auVar15);
    alVar37[0]._0_4_ = auVar6._0_4_ << shift;
    alVar37[0]._4_4_ = auVar6._4_4_;
    alVar37[1]._0_4_ = auVar6._8_4_;
    alVar37[1]._4_4_ = auVar6._12_4_;
    out[3] = alVar37;
    auVar6 = pmovsxwd((undefined1  [16])alVar37,(undefined1  [16])alVar8);
    *(int *)out[4] = auVar6._0_4_ << shift;
    *(int *)((long)out[4] + 4) = auVar6._4_4_;
    *(int *)(out[4] + 1) = auVar6._8_4_;
    *(int *)((long)out[4] + 0xc) = auVar6._12_4_;
    auVar47 = pmovsxwd((undefined1  [16])alVar46,(undefined1  [16])alVar35);
    auVar23._0_8_ = alVar35[1];
    auVar23._8_4_ = (int)alVar35[1];
    auVar23._12_4_ = alVar35[1]._4_4_;
    auVar15 = pmovsxwd(auVar23,auVar23);
    auVar11._8_4_ = (undefined4)alVar8[1];
    auVar11._12_4_ = alVar8[1]._4_4_;
    auVar11._0_8_ = alVar8[1];
    auVar6 = pmovsxwd(auVar11,auVar11);
    alVar19[0]._0_4_ = auVar6._0_4_ << shift;
    alVar19[0]._4_4_ = auVar6._4_4_;
    alVar19[1]._0_4_ = auVar6._8_4_;
    alVar19[1]._4_4_ = auVar6._12_4_;
    out[5] = alVar19;
    auVar6 = pmovsxwd((undefined1  [16])alVar19,(undefined1  [16])alVar2);
    alVar8[0]._0_4_ = auVar6._0_4_ << shift;
    alVar8[0]._4_4_ = auVar6._4_4_;
    alVar8[1]._0_4_ = auVar6._8_4_;
    alVar8[1]._4_4_ = auVar6._12_4_;
    out[6] = alVar8;
    auVar11 = pmovsxwd((undefined1  [16])alVar8,(undefined1  [16])alVar13);
    auVar30._8_4_ = (undefined4)alVar13[1];
    auVar30._12_4_ = alVar13[1]._4_4_;
    auVar30._0_8_ = alVar13[1];
    auVar23 = pmovsxwd(auVar30,auVar30);
    auVar6._8_4_ = (undefined4)alVar2[1];
    auVar6._12_4_ = alVar2[1]._4_4_;
    auVar6._0_8_ = alVar2[1];
    auVar6 = pmovsxwd(auVar6,auVar6);
    alVar26[0]._0_4_ = auVar6._0_4_ << shift;
    alVar26[0]._4_4_ = auVar6._4_4_;
    alVar26[1]._0_4_ = auVar6._8_4_;
    alVar26[1]._4_4_ = auVar6._12_4_;
    out[7] = alVar26;
    auVar6 = pmovsxwd((undefined1  [16])alVar26,auVar43);
    auVar43._0_8_ = auVar43._8_8_;
    auVar43 = pmovsxwd(auVar43,auVar43);
    *(int *)out[8] = auVar39._0_4_ << shift;
    *(int *)((long)out[8] + 4) = auVar39._4_4_;
    *(int *)(out[8] + 1) = auVar39._8_4_;
    *(int *)((long)out[8] + 0xc) = auVar39._12_4_;
    *(int *)out[9] = auVar45._0_4_ << shift;
    *(int *)((long)out[9] + 4) = auVar45._4_4_;
    *(int *)(out[9] + 1) = auVar45._8_4_;
    *(int *)((long)out[9] + 0xc) = auVar45._12_4_;
    alVar4[0]._0_4_ = auVar47._0_4_ << shift;
    alVar4[0]._4_4_ = auVar47._4_4_;
    alVar4[1]._0_4_ = auVar47._8_4_;
    alVar4[1]._4_4_ = auVar47._12_4_;
    out[10] = alVar4;
    *(int *)out[0xb] = auVar15._0_4_ << shift;
    *(int *)((long)out[0xb] + 4) = auVar15._4_4_;
    *(int *)(out[0xb] + 1) = auVar15._8_4_;
    *(int *)((long)out[0xb] + 0xc) = auVar15._12_4_;
    *(int *)out[0xc] = auVar11._0_4_ << shift;
    *(int *)((long)out[0xc] + 4) = auVar11._4_4_;
    *(int *)(out[0xc] + 1) = auVar11._8_4_;
    *(int *)((long)out[0xc] + 0xc) = auVar11._12_4_;
    *(int *)out[0xd] = auVar23._0_4_ << shift;
    *(int *)((long)out[0xd] + 4) = auVar23._4_4_;
    *(int *)(out[0xd] + 1) = auVar23._8_4_;
    *(int *)((long)out[0xd] + 0xc) = auVar23._12_4_;
    *(int *)out[0xe] = auVar6._0_4_ << shift;
    *(int *)((long)out[0xe] + 4) = auVar6._4_4_;
    *(int *)(out[0xe] + 1) = auVar6._8_4_;
    *(int *)((long)out[0xe] + 0xc) = auVar6._12_4_;
    *(int *)out[0xf] = auVar43._0_4_ << shift;
    *(int *)((long)out[0xf] + 4) = auVar43._4_4_;
    *(int *)(out[0xf] + 1) = auVar43._8_4_;
    *(int *)((long)out[0xf] + 0xc) = auVar43._12_4_;
    alVar26 = *palVar1;
    out[0x10] = alVar26;
    alVar19 = *(__m128i *)((long)*palVar1 + (long)stride * 2);
    out[0x11] = alVar19;
    alVar8 = *(__m128i *)((long)*palVar1 + (long)(stride * 2) * 2);
    out[0x12] = alVar8;
    alVar2 = *(__m128i *)((long)*palVar1 + (long)(stride * 3) * 2);
    out[0x13] = alVar2;
    alVar37 = *(__m128i *)((long)*palVar1 + (long)(stride * 4) * 2);
    out[0x14] = alVar37;
    alVar35 = *(__m128i *)((long)*palVar1 + (long)(stride * 5) * 2);
    out[0x15] = alVar35;
    alVar13 = *(__m128i *)((long)*palVar1 + (long)(stride * 6) * 2);
    out[0x16] = alVar13;
    auVar43 = *(undefined1 (*) [16])((long)*palVar1 + (long)(stride * 7) * 2);
  }
  else {
    alVar26 = *(__m128i *)((long)*palVar1 + (long)(stride * 7) * 2);
    *out = alVar26;
    alVar19 = *(__m128i *)((long)*palVar1 + (long)(stride * 6) * 2);
    out[1] = alVar19;
    alVar8 = *(__m128i *)((long)*palVar1 + (long)(stride * 5) * 2);
    out[2] = alVar8;
    alVar2 = *(__m128i *)((long)*palVar1 + (long)(stride * 4) * 2);
    out[3] = alVar2;
    alVar37 = *(__m128i *)((long)*palVar1 + (long)(stride * 3) * 2);
    out[4] = alVar37;
    alVar35 = *(__m128i *)((long)*palVar1 + (long)(stride * 2) * 2);
    out[5] = alVar35;
    alVar13 = *(__m128i *)((long)*palVar1 + (long)stride * 2);
    out[6] = alVar13;
    alVar4 = *palVar1;
    if (fliplr != 0) {
      alVar37 = (__m128i)pshufb((undefined1  [16])alVar37,(undefined1  [16])_DAT_0056c1a0);
      alVar35 = (__m128i)pshufb((undefined1  [16])alVar35,(undefined1  [16])_DAT_0056c1a0);
      alVar13 = (__m128i)pshufb((undefined1  [16])alVar13,(undefined1  [16])_DAT_0056c1a0);
      alVar4 = (__m128i)pshufb((undefined1  [16])alVar4,(undefined1  [16])_DAT_0056c1a0);
      alVar2 = (__m128i)pshufb((undefined1  [16])alVar2,(undefined1  [16])_DAT_0056c1a0);
      alVar8 = (__m128i)pshufb((undefined1  [16])alVar8,(undefined1  [16])_DAT_0056c1a0);
      alVar19 = (__m128i)pshufb((undefined1  [16])alVar19,(undefined1  [16])_DAT_0056c1a0);
      alVar26 = (__m128i)pshufb((undefined1  [16])alVar26,(undefined1  [16])_DAT_0056c1a0);
      in_XMM9 = _DAT_0056c1a0;
    }
    auVar43 = pmovsxwd((undefined1  [16])in_XMM9,(undefined1  [16])alVar26);
    alVar44[0]._0_4_ = auVar43._0_4_ << shift;
    alVar44[0]._4_4_ = auVar43._4_4_;
    alVar44[1]._0_4_ = auVar43._8_4_;
    alVar44[1]._4_4_ = auVar43._12_4_;
    *out = alVar44;
    auVar27._8_4_ = (undefined4)alVar26[1];
    auVar27._12_4_ = alVar26[1]._4_4_;
    auVar27._0_8_ = alVar26[1];
    auVar43 = pmovsxwd(auVar27,auVar27);
    alVar28[0]._0_4_ = auVar43._0_4_ << shift;
    alVar28[0]._4_4_ = auVar43._4_4_;
    alVar28[1]._0_4_ = auVar43._8_4_;
    alVar28[1]._4_4_ = auVar43._12_4_;
    out[1] = alVar28;
    auVar43 = pmovsxwd((undefined1  [16])alVar28,(undefined1  [16])alVar19);
    alVar29[0]._0_4_ = auVar43._0_4_ << shift;
    alVar29[0]._4_4_ = auVar43._4_4_;
    alVar29[1]._0_4_ = auVar43._8_4_;
    alVar29[1]._4_4_ = auVar43._12_4_;
    out[2] = alVar29;
    auVar30 = pmovsxwd((undefined1  [16])alVar29,(undefined1  [16])alVar37);
    auVar38._8_4_ = (undefined4)alVar37[1];
    auVar38._12_4_ = alVar37[1]._4_4_;
    auVar38._0_8_ = alVar37[1];
    auVar39 = pmovsxwd(auVar38,auVar38);
    auVar20._8_4_ = (undefined4)alVar19[1];
    auVar20._12_4_ = alVar19[1]._4_4_;
    auVar20._0_8_ = alVar19[1];
    auVar43 = pmovsxwd(auVar20,auVar20);
    alVar21[0]._0_4_ = auVar43._0_4_ << shift;
    alVar21[0]._4_4_ = auVar43._4_4_;
    alVar21[1]._0_4_ = auVar43._8_4_;
    alVar21[1]._4_4_ = auVar43._12_4_;
    out[3] = alVar21;
    auVar43 = pmovsxwd((undefined1  [16])alVar21,(undefined1  [16])alVar8);
    *(int *)out[4] = auVar43._0_4_ << shift;
    *(int *)((long)out[4] + 4) = auVar43._4_4_;
    *(int *)(out[4] + 1) = auVar43._8_4_;
    *(int *)((long)out[4] + 0xc) = auVar43._12_4_;
    auVar45 = pmovsxwd((undefined1  [16])alVar44,(undefined1  [16])alVar35);
    auVar22._0_8_ = alVar35[1];
    auVar22._8_4_ = (int)alVar35[1];
    auVar22._12_4_ = alVar35[1]._4_4_;
    auVar23 = pmovsxwd(auVar22,auVar22);
    auVar9._8_4_ = (undefined4)alVar8[1];
    auVar9._12_4_ = alVar8[1]._4_4_;
    auVar9._0_8_ = alVar8[1];
    auVar43 = pmovsxwd(auVar9,auVar9);
    alVar35[0]._0_4_ = auVar43._0_4_ << shift;
    alVar35[0]._4_4_ = auVar43._4_4_;
    alVar35[1]._0_4_ = auVar43._8_4_;
    alVar35[1]._4_4_ = auVar43._12_4_;
    out[5] = alVar35;
    auVar43 = pmovsxwd((undefined1  [16])alVar35,(undefined1  [16])alVar2);
    alVar10[0]._0_4_ = auVar43._0_4_ << shift;
    alVar10[0]._4_4_ = auVar43._4_4_;
    alVar10[1]._0_4_ = auVar43._8_4_;
    alVar10[1]._4_4_ = auVar43._12_4_;
    out[6] = alVar10;
    auVar11 = pmovsxwd((undefined1  [16])alVar10,(undefined1  [16])alVar13);
    auVar14._8_4_ = (undefined4)alVar13[1];
    auVar14._12_4_ = alVar13[1]._4_4_;
    auVar14._0_8_ = alVar13[1];
    auVar15 = pmovsxwd(auVar14,auVar14);
    auVar47._8_4_ = (undefined4)alVar2[1];
    auVar47._12_4_ = alVar2[1]._4_4_;
    auVar47._0_8_ = alVar2[1];
    auVar43 = pmovsxwd(auVar47,auVar47);
    alVar2[0]._0_4_ = auVar43._0_4_ << shift;
    alVar2[0]._4_4_ = auVar43._4_4_;
    alVar2[1]._0_4_ = auVar43._8_4_;
    alVar2[1]._4_4_ = auVar43._12_4_;
    out[7] = alVar2;
    auVar43 = pmovsxwd((undefined1  [16])alVar2,(undefined1  [16])alVar4);
    auVar5._8_4_ = (undefined4)alVar4[1];
    auVar5._12_4_ = alVar4[1]._4_4_;
    auVar5._0_8_ = alVar4[1];
    auVar6 = pmovsxwd(auVar5,auVar5);
    *(int *)out[8] = auVar30._0_4_ << shift;
    *(int *)((long)out[8] + 4) = auVar30._4_4_;
    *(int *)(out[8] + 1) = auVar30._8_4_;
    *(int *)((long)out[8] + 0xc) = auVar30._12_4_;
    *(int *)out[9] = auVar39._0_4_ << shift;
    *(int *)((long)out[9] + 4) = auVar39._4_4_;
    *(int *)(out[9] + 1) = auVar39._8_4_;
    *(int *)((long)out[9] + 0xc) = auVar39._12_4_;
    alVar4[0]._0_4_ = auVar45._0_4_ << shift;
    alVar4[0]._4_4_ = auVar45._4_4_;
    alVar4[1]._0_4_ = auVar45._8_4_;
    alVar4[1]._4_4_ = auVar45._12_4_;
    out[10] = alVar4;
    *(int *)out[0xb] = auVar23._0_4_ << shift;
    *(int *)((long)out[0xb] + 4) = auVar23._4_4_;
    *(int *)(out[0xb] + 1) = auVar23._8_4_;
    *(int *)((long)out[0xb] + 0xc) = auVar23._12_4_;
    *(int *)out[0xc] = auVar11._0_4_ << shift;
    *(int *)((long)out[0xc] + 4) = auVar11._4_4_;
    *(int *)(out[0xc] + 1) = auVar11._8_4_;
    *(int *)((long)out[0xc] + 0xc) = auVar11._12_4_;
    *(int *)out[0xd] = auVar15._0_4_ << shift;
    *(int *)((long)out[0xd] + 4) = auVar15._4_4_;
    *(int *)(out[0xd] + 1) = auVar15._8_4_;
    *(int *)((long)out[0xd] + 0xc) = auVar15._12_4_;
    *(int *)out[0xe] = auVar43._0_4_ << shift;
    *(int *)((long)out[0xe] + 4) = auVar43._4_4_;
    *(int *)(out[0xe] + 1) = auVar43._8_4_;
    *(int *)((long)out[0xe] + 0xc) = auVar43._12_4_;
    *(int *)out[0xf] = auVar6._0_4_ << shift;
    *(int *)((long)out[0xf] + 4) = auVar6._4_4_;
    *(int *)(out[0xf] + 1) = auVar6._8_4_;
    *(int *)((long)out[0xf] + 0xc) = auVar6._12_4_;
    alVar26 = *(__m128i *)(input + stride * 7);
    out[0x10] = alVar26;
    alVar19 = *(__m128i *)(input + stride * 6);
    out[0x11] = alVar19;
    alVar8 = *(__m128i *)(input + stride * 5);
    out[0x12] = alVar8;
    alVar2 = *(__m128i *)(input + stride * 4);
    out[0x13] = alVar2;
    alVar37 = *(__m128i *)(input + stride * 3);
    out[0x14] = alVar37;
    alVar35 = *(__m128i *)(input + stride * 2);
    out[0x15] = alVar35;
    alVar13 = *(__m128i *)(input + stride);
    out[0x16] = alVar13;
    auVar43 = *(undefined1 (*) [16])input;
  }
  if (fliplr != 0) {
    alVar37 = (__m128i)pshufb((undefined1  [16])alVar37,(undefined1  [16])_DAT_0056c1a0);
    alVar35 = (__m128i)pshufb((undefined1  [16])alVar35,(undefined1  [16])_DAT_0056c1a0);
    alVar13 = (__m128i)pshufb((undefined1  [16])alVar13,(undefined1  [16])_DAT_0056c1a0);
    auVar43 = pshufb(auVar43,(undefined1  [16])_DAT_0056c1a0);
    alVar2 = (__m128i)pshufb((undefined1  [16])alVar2,(undefined1  [16])_DAT_0056c1a0);
    alVar8 = (__m128i)pshufb((undefined1  [16])alVar8,(undefined1  [16])_DAT_0056c1a0);
    alVar19 = (__m128i)pshufb((undefined1  [16])alVar19,(undefined1  [16])_DAT_0056c1a0);
    alVar26 = (__m128i)pshufb((undefined1  [16])alVar26,(undefined1  [16])_DAT_0056c1a0);
    alVar4 = _DAT_0056c1a0;
  }
  auVar6 = pmovsxwd((undefined1  [16])alVar4,(undefined1  [16])alVar26);
  *(int *)out[0x10] = auVar6._0_4_ << shift;
  *(int *)((long)out[0x10] + 4) = auVar6._4_4_;
  *(int *)(out[0x10] + 1) = auVar6._8_4_;
  *(int *)((long)out[0x10] + 0xc) = auVar6._12_4_;
  auVar40._8_4_ = (undefined4)alVar26[1];
  auVar40._12_4_ = alVar26[1]._4_4_;
  auVar40._0_8_ = alVar26[1];
  auVar6 = pmovsxwd(auVar40,auVar40);
  alVar41[0]._0_4_ = auVar6._0_4_ << shift;
  alVar41[0]._4_4_ = auVar6._4_4_;
  alVar41[1]._0_4_ = auVar6._8_4_;
  alVar41[1]._4_4_ = auVar6._12_4_;
  out[0x11] = alVar41;
  auVar6 = pmovsxwd((undefined1  [16])alVar41,(undefined1  [16])alVar19);
  alVar42[0]._0_4_ = auVar6._0_4_ << shift;
  alVar42[0]._4_4_ = auVar6._4_4_;
  alVar42[1]._0_4_ = auVar6._8_4_;
  alVar42[1]._4_4_ = auVar6._12_4_;
  out[0x12] = alVar42;
  auVar11 = pmovsxwd((undefined1  [16])alVar42,(undefined1  [16])alVar8);
  auVar36._8_4_ = (undefined4)alVar19[1];
  auVar36._12_4_ = alVar19[1]._4_4_;
  auVar36._0_8_ = alVar19[1];
  auVar6 = pmovsxwd(auVar36,auVar36);
  *(int *)out[0x13] = auVar6._0_4_ << shift;
  *(int *)((long)out[0x13] + 4) = auVar6._4_4_;
  *(int *)(out[0x13] + 1) = auVar6._8_4_;
  *(int *)((long)out[0x13] + 0xc) = auVar6._12_4_;
  *(int *)out[0x14] = auVar11._0_4_ << shift;
  *(int *)((long)out[0x14] + 4) = auVar11._4_4_;
  *(int *)(out[0x14] + 1) = auVar11._8_4_;
  *(int *)((long)out[0x14] + 0xc) = auVar11._12_4_;
  auVar33._8_4_ = (undefined4)alVar8[1];
  auVar33._12_4_ = alVar8[1]._4_4_;
  auVar33._0_8_ = alVar8[1];
  auVar6 = pmovsxwd(auVar33,auVar33);
  alVar34[0]._0_4_ = auVar6._0_4_ << shift;
  alVar34[0]._4_4_ = auVar6._4_4_;
  alVar34[1]._0_4_ = auVar6._8_4_;
  alVar34[1]._4_4_ = auVar6._12_4_;
  out[0x15] = alVar34;
  auVar6 = pmovsxwd((undefined1  [16])alVar34,(undefined1  [16])alVar2);
  *(int *)out[0x16] = auVar6._0_4_ << shift;
  *(int *)((long)out[0x16] + 4) = auVar6._4_4_;
  *(int *)(out[0x16] + 1) = auVar6._8_4_;
  *(int *)((long)out[0x16] + 0xc) = auVar6._12_4_;
  auVar24._8_4_ = (undefined4)alVar2[1];
  auVar24._12_4_ = alVar2[1]._4_4_;
  auVar24._0_8_ = alVar2[1];
  auVar6 = pmovsxwd(auVar24,auVar24);
  alVar25[0]._0_4_ = auVar6._0_4_ << shift;
  alVar25[0]._4_4_ = auVar6._4_4_;
  alVar25[1]._0_4_ = auVar6._8_4_;
  alVar25[1]._4_4_ = auVar6._12_4_;
  out[0x17] = alVar25;
  auVar6 = pmovsxwd((undefined1  [16])alVar25,(undefined1  [16])alVar37);
  *(int *)out[0x18] = auVar6._0_4_ << shift;
  *(int *)((long)out[0x18] + 4) = auVar6._4_4_;
  *(int *)(out[0x18] + 1) = auVar6._8_4_;
  *(int *)((long)out[0x18] + 0xc) = auVar6._12_4_;
  auVar16._8_4_ = (undefined4)alVar37[1];
  auVar16._12_4_ = alVar37[1]._4_4_;
  auVar16._0_8_ = alVar37[1];
  auVar6 = pmovsxwd(auVar16,auVar16);
  alVar17[0]._0_4_ = auVar6._0_4_ << shift;
  alVar17[0]._4_4_ = auVar6._4_4_;
  alVar17[1]._0_4_ = auVar6._8_4_;
  alVar17[1]._4_4_ = auVar6._12_4_;
  out[0x19] = alVar17;
  auVar11 = pmovsxwd((undefined1  [16])alVar17,(undefined1  [16])alVar35);
  auVar12._8_4_ = (undefined4)alVar35[1];
  auVar12._12_4_ = alVar35[1]._4_4_;
  auVar12._0_8_ = alVar35[1];
  auVar6 = pmovsxwd(auVar12,auVar12);
  alVar18[0]._0_4_ = auVar11._0_4_ << shift;
  alVar18[0]._4_4_ = auVar11._4_4_;
  alVar18[1]._0_4_ = auVar11._8_4_;
  alVar18[1]._4_4_ = auVar11._12_4_;
  out[0x1a] = alVar18;
  auVar11 = pmovsxwd((undefined1  [16])alVar18,(undefined1  [16])alVar13);
  *(int *)out[0x1b] = auVar6._0_4_ << shift;
  *(int *)((long)out[0x1b] + 4) = auVar6._4_4_;
  *(int *)(out[0x1b] + 1) = auVar6._8_4_;
  *(int *)((long)out[0x1b] + 0xc) = auVar6._12_4_;
  *(int *)out[0x1c] = auVar11._0_4_ << shift;
  *(int *)((long)out[0x1c] + 4) = auVar11._4_4_;
  *(int *)(out[0x1c] + 1) = auVar11._8_4_;
  *(int *)((long)out[0x1c] + 0xc) = auVar11._12_4_;
  auVar7._8_4_ = (undefined4)alVar13[1];
  auVar7._12_4_ = alVar13[1]._4_4_;
  auVar7._0_8_ = alVar13[1];
  auVar6 = pmovsxwd(auVar7,auVar7);
  alVar13[0]._0_4_ = auVar6._0_4_ << shift;
  alVar13[0]._4_4_ = auVar6._4_4_;
  alVar13[1]._0_4_ = auVar6._8_4_;
  alVar13[1]._4_4_ = auVar6._12_4_;
  out[0x1d] = alVar13;
  auVar6 = pmovsxwd((undefined1  [16])alVar13,auVar43);
  *(int *)out[0x1e] = auVar6._0_4_ << shift;
  *(int *)((long)out[0x1e] + 4) = auVar6._4_4_;
  *(int *)(out[0x1e] + 1) = auVar6._8_4_;
  *(int *)((long)out[0x1e] + 0xc) = auVar6._12_4_;
  auVar3._8_4_ = auVar43._8_4_;
  auVar3._12_4_ = auVar43._12_4_;
  auVar3._0_8_ = auVar43._8_8_;
  auVar43 = pmovsxwd(auVar3,auVar3);
  *(int *)out[0x1f] = auVar43._0_4_ << shift;
  *(int *)((long)out[0x1f] + 4) = auVar43._4_4_;
  *(int *)(out[0x1f] + 1) = auVar43._8_4_;
  *(int *)((long)out[0x1f] + 0xc) = auVar43._12_4_;
  return;
}

Assistant:

static inline void load_buffer_8x16(const int16_t *input, __m128i *out,
                                    int stride, int flipud, int fliplr,
                                    int shift) {
  const int16_t *topL = input;
  const int16_t *botL = input + 8 * stride;

  const int16_t *tmp;

  if (flipud) {
    tmp = topL;
    topL = botL;
    botL = tmp;
  }

  load_buffer_8x8(topL, out, stride, flipud, fliplr, shift);
  load_buffer_8x8(botL, out + 16, stride, flipud, fliplr, shift);
}